

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.cpp
# Opt level: O0

int __thiscall Peers::connect(Peers *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  Socket __fd_00;
  ostream *poVar2;
  char *__cp;
  ostream *extraout_RAX;
  undefined4 in_register_00000034;
  unique_ptr<Peer,_std::default_delete<Peer>_> local_50;
  undefined4 local_48;
  int local_44;
  unique_ptr<Peer,_std::default_delete<Peer>_> local_40;
  unique_ptr<Peer,_std::default_delete<Peer>_> peer;
  sockaddr_in addr;
  SocketResource socket;
  uint16_t port_local;
  string *remotePeerAddr_local;
  Peers *this_local;
  
  addr.sin_zero._6_2_ = SUB82(__addr,0);
  if ((ushort)addr.sin_zero._6_2_ < 1000) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Invalid remote peer port\n");
    this_local._7_1_ = 0;
  }
  else {
    addr.sin_zero._0_4_ = SocketResource::create();
    peer._M_t.super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
    super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.super__Head_base<0UL,_Peer_*,_false>.
    _M_head_impl._0_2_ = 2;
    peer._M_t.super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
    super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.super__Head_base<0UL,_Peer_*,_false>.
    _M_head_impl._2_2_ = htons(addr.sin_zero._6_2_);
    __cp = (char *)std::__cxx11::string::c_str();
    iVar1 = inet_pton(2,__cp,(void *)((long)&peer._M_t.
                                             super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>
                                             .super__Head_base<0UL,_Peer_*,_false>._M_head_impl + 4)
                     );
    if (iVar1 < 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Peers: Invalid IPv4 host address\n");
      this_local._7_1_ = 0;
    }
    else {
      __fd_00 = SocketResource::resource((SocketResource *)addr.sin_zero);
      iVar1 = ::connect(__fd_00,(sockaddr *)&peer,0x10);
      if (iVar1 == 0) {
        local_44._0_1_ = addr.sin_zero[0];
        local_44._1_1_ = addr.sin_zero[1];
        local_44._2_1_ = addr.sin_zero[2];
        local_44._3_1_ = addr.sin_zero[3];
        local_48 = 0;
        std::make_unique<Peer,P2PSocket*&,SocketResource,int>
                  ((P2PSocket **)&local_40,(SocketResource *)&this->m_p2pSocket,&local_44);
        std::unique_ptr<Peer,_std::default_delete<Peer>_>::unique_ptr(&local_50,&local_40);
        peerIsConnected(this,&local_50);
        std::unique_ptr<Peer,_std::default_delete<Peer>_>::~unique_ptr(&local_50);
        this_local._7_1_ = 1;
        std::unique_ptr<Peer,_std::default_delete<Peer>_>::~unique_ptr(&local_40);
        poVar2 = extraout_RAX;
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Peer connection to ");
        poVar2 = std::operator<<(poVar2,(string *)CONCAT44(in_register_00000034,__fd));
        poVar2 = std::operator<<(poVar2," on port ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,addr.sin_zero._6_2_);
        poVar2 = std::operator<<(poVar2," failed");
        this_local._7_1_ = 0;
      }
    }
  }
  return (int)CONCAT71((int7)((ulong)poVar2 >> 8),this_local._7_1_);
}

Assistant:

bool Peers::connect(const std::string &remotePeerAddr, uint16_t port)
{
    if (port < 0x3E8 || port > 0xFFFF) {
        std::cout << "Invalid remote peer port\n";
        return false;
    }
    auto socket = SocketResource::create();

    sockaddr_in addr;
    addr.sin_family = AF_INET;
    addr.sin_port = htons(port);
#ifdef _WIN32
    auto ipAddr = ::inet_addr(remotePeerAddr.c_str());
    if (ipAddr == INADDR_NONE)
        return false;
    if (ipAddr == INADDR_ANY)
        return false;
    address.sin_addr.s_addr = ipAddr;
#else
    if (::inet_pton(AF_INET, remotePeerAddr.c_str(), &addr.sin_addr) <= 0) {
        std::cout << "Peers: Invalid IPv4 host address\n";
        return false;
    }
#endif
    if (::connect(socket.resource(), (struct sockaddr *)&addr, sizeof(addr)) != NO_ERROR) {
        std::cout << "Peer connection to " << remotePeerAddr << " on port " << port << " failed";
        return false;
    }

    std::unique_ptr<Peer> peer = std::make_unique<Peer>(m_p2pSocket, SocketResource(socket), 0);
    peerIsConnected(std::move(peer));
    return true;
}